

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.c
# Opt level: O0

char * read_letter(Lexer *lexer,CharBuff *buff)

{
  uint chr_00;
  int iVar1;
  char *pcVar2;
  int chr;
  CharBuff *buff_local;
  Lexer *lexer_local;
  
  do {
    chr_00 = read_chr(lexer);
    if (chr_00 == 0xc9) {
LAB_001026c1:
      pcVar2 = to_string(buff);
      return pcVar2;
    }
    iVar1 = is_letter(chr_00);
    if (iVar1 == 0) {
      iVar1 = is_symbol(chr_00);
      if (iVar1 == 0) {
        iVar1 = is_digit(chr_00);
        if ((iVar1 == 0) && (-1 < (int)chr_00)) {
          unread_chr(lexer,chr_00);
          goto LAB_001026c1;
        }
      }
    }
    append_chr(buff,(char)chr_00);
  } while( true );
}

Assistant:

char *read_letter(Lexer *lexer, CharBuff* buff) {
    int chr;
    while ((chr = read_chr(lexer)) != END) {
        // a_9 | a$9
        if (is_letter(chr) || is_symbol(chr) || is_digit(chr) || chr < 0) {
            append_chr(buff, (char) chr);
        } else {
            unread_chr(lexer, chr);
            break;
        }
    }
    return to_string(buff);;
}